

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenization_args.h
# Opt level: O2

Options * build_tokenization_options(Options *__return_storage_ptr__,ParseResult *args)

{
  pointer pbVar1;
  Mode MVar2;
  OptionValue *pOVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool *pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  allocator<char> local_31;
  string local_30;
  
  onmt::Tokenizer::Options::Options(__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"mode",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
  MVar2 = onmt::Tokenizer::str_to_mode((string *)pbVar4);
  __return_storage_ptr__->mode = MVar2;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"lang",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->lang);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"no_substitution",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->no_substitution = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"with_separators",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->with_separators = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"allow_isolated_marks",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->allow_isolated_marks = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"case_feature",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->case_feature = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"case_markup",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->case_markup = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"soft_case_regions",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->soft_case_regions = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"joiner_annotate",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->joiner_annotate = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"joiner_new",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->joiner_new = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"joiner",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->joiner);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"spacer_annotate",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->spacer_annotate = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"spacer_new",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->spacer_new = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"preserve_placeholders",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->preserve_placeholders = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"preserve_segmented_tokens",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->preserve_segmented_tokens = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"support_prior_joiners",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->support_prior_joiners = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"segment_case",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->segment_case = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"segment_numbers",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->segment_numbers = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"segment_alphabet_change",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar5 = cxxopts::OptionValue::as<bool>(pOVar3);
  __return_storage_ptr__->segment_alphabet_change = *pbVar5;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"segment_alphabet",&local_31);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_30);
  __x = cxxopts::OptionValue::
        as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pOVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->segment_alphabet,__x);
  std::__cxx11::string::~string((string *)&local_30);
  pbVar1 = (__return_storage_ptr__->segment_alphabet).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(__return_storage_ptr__->segment_alphabet).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x20) &&
     (pbVar1->_M_string_length == 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&__return_storage_ptr__->segment_alphabet);
  }
  return __return_storage_ptr__;
}

Assistant:

inline onmt::Tokenizer::Options build_tokenization_options(const cxxopts::ParseResult& args)
{
  onmt::Tokenizer::Options options;
  options.mode = onmt::Tokenizer::str_to_mode(args["mode"].as<std::string>());
  options.lang = args["lang"].as<std::string>();
  options.no_substitution = args["no_substitution"].as<bool>();
  options.with_separators = args["with_separators"].as<bool>();
  options.allow_isolated_marks = args["allow_isolated_marks"].as<bool>();
  options.case_feature = args["case_feature"].as<bool>();
  options.case_markup = args["case_markup"].as<bool>();
  options.soft_case_regions = args["soft_case_regions"].as<bool>();
  options.joiner_annotate = args["joiner_annotate"].as<bool>();
  options.joiner_new = args["joiner_new"].as<bool>();
  options.joiner = args["joiner"].as<std::string>();
  options.spacer_annotate = args["spacer_annotate"].as<bool>();
  options.spacer_new = args["spacer_new"].as<bool>();
  options.preserve_placeholders = args["preserve_placeholders"].as<bool>();
  options.preserve_segmented_tokens = args["preserve_segmented_tokens"].as<bool>();
  options.support_prior_joiners = args["support_prior_joiners"].as<bool>();
  options.segment_case = args["segment_case"].as<bool>();
  options.segment_numbers = args["segment_numbers"].as<bool>();
  options.segment_alphabet_change = args["segment_alphabet_change"].as<bool>();
  options.segment_alphabet = args["segment_alphabet"].as<std::vector<std::string>>();
  if (options.segment_alphabet.size() == 1 && options.segment_alphabet[0].empty())
    options.segment_alphabet.clear();
  return options;
}